

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolu.c
# Opt level: O0

int ffpclu(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelempar,
          int *status)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long in_RCX;
  uint in_ESI;
  long in_R8;
  fitsfile *in_R9;
  size_t buffsize;
  long jbuff [2];
  char snull [20];
  char message [81];
  char *cstring;
  char tform [20];
  uchar lognul;
  uchar i1null;
  double zero;
  double scale;
  LONGLONG ntodo;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG wrtptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  LONGLONG i8null;
  LONGLONG tnull;
  LONGLONG nelem;
  LONGLONG largeelem;
  LONGLONG ii;
  long incre;
  long twidth;
  int i4null;
  short i2null;
  int leng;
  int writemode;
  int hdutype;
  int maxelem;
  int tcode;
  undefined1 *nvals;
  int *in_stack_fffffffffffffd70;
  double *dvalues;
  long *in_stack_fffffffffffffd78;
  undefined1 *nvals_00;
  long *in_stack_fffffffffffffd80;
  size_t *svalues;
  int *in_stack_fffffffffffffd88;
  fitsfile *fptr_00;
  undefined8 in_stack_fffffffffffffd90;
  fitsfile *in_stack_fffffffffffffd98;
  int *status_00;
  long *buffer;
  undefined1 *nbytes;
  fitsfile *fptr_01;
  long local_210;
  size_t local_208;
  undefined8 in_stack_fffffffffffffe30;
  LONGLONG nelem_00;
  LONGLONG firstelem_00;
  char in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe49;
  int in_stack_fffffffffffffe54;
  fitsfile *in_stack_fffffffffffffe58;
  char local_198 [8];
  double *in_stack_fffffffffffffe70;
  double *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  long *in_stack_fffffffffffffe88;
  int *in_stack_fffffffffffffe90;
  int *in_stack_fffffffffffffe98;
  LONGLONG *in_stack_fffffffffffffea0;
  LONGLONG *in_stack_fffffffffffffea8;
  long *in_stack_fffffffffffffeb0;
  LONGLONG *in_stack_fffffffffffffeb8;
  LONGLONG *rowlen_00;
  int *in_stack_fffffffffffffec8;
  LONGLONG *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  undefined6 in_stack_fffffffffffffee0;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffee7;
  double local_118;
  undefined1 local_110 [8];
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  size_t local_90;
  undefined4 local_84;
  undefined2 local_7e;
  int local_7c;
  undefined4 local_78;
  int local_74 [2];
  undefined1 local_6c [40];
  uint local_44;
  int local_34;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  local_78 = 2;
  uVar4 = 0;
  rowlen_00 = (LONGLONG *)0x0;
  nelem_00 = -1;
  firstelem_00 = -1;
  if (in_R9->HDUposition < 1) {
    local_b0 = in_R8;
    local_a8 = in_RCX;
    local_6c._4_8_ = in_R9;
    local_44 = in_ESI;
    ffgtcl(in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20),
           in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
           in_stack_fffffffffffffd70);
    if ((int)local_6c._0_4_ < 0) {
      local_78 = 0;
    }
    iVar1 = local_6c._0_4_;
    if ((int)local_6c._0_4_ < 1) {
      iVar1 = -local_6c._0_4_;
    }
    if (0x52 < iVar1) {
      local_a8 = (local_a8 + -1) * 2 + 1;
      local_b0 = local_b0 << 1;
    }
    nvals_00 = &stack0xfffffffffffffec8;
    nbytes = &stack0xfffffffffffffe48;
    nvals = local_110;
    dvalues = &local_118;
    svalues = &local_90;
    fptr_00 = (fitsfile *)local_6c;
    status_00 = local_74;
    buffer = &local_b8;
    fptr_01 = (fitsfile *)local_6c._4_8_;
    iVar2 = ffgcprll(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                     CONCAT71(in_stack_fffffffffffffe49,in_stack_fffffffffffffe48),firstelem_00,
                     nelem_00,iVar2,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                     in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,
                     in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,
                     in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,rowlen_00,
                     in_stack_fffffffffffffec8,in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,
                     (int *)CONCAT17(in_stack_fffffffffffffee7,
                                     CONCAT16(uVar4,in_stack_fffffffffffffee0)));
    if (iVar2 < 1) {
      if (local_6c._0_4_ == 0x10) {
        if (in_stack_fffffffffffffe48 == '\x01') {
          ffpmsg((char *)0x2231ba);
          *(int *)local_6c._4_8_ = 0x13a;
          return 0x13a;
        }
        if ((long)local_90 < 0x14) {
          local_208 = 0x14;
        }
        else {
          local_208 = local_90;
        }
        rowlen_00 = (LONGLONG *)malloc(local_208);
        if (rowlen_00 == (LONGLONG *)0x0) {
          *(int *)local_6c._4_8_ = 0x71;
          return 0x71;
        }
        memset(rowlen_00,0x20,local_208);
        sVar3 = strlen(&stack0xfffffffffffffe48);
        local_7c = (int)sVar3;
        if (local_74[0] == 2) {
          local_7c = local_7c + 1;
        }
        strncpy((char *)rowlen_00,&stack0xfffffffffffffe48,(long)local_7c);
      }
      else if ((((local_6c._0_4_ == 0xb) || (local_6c._0_4_ == 0x15)) || (local_6c._0_4_ == 0x29))
              || (local_6c._0_4_ == 0x51)) {
        if (local_b8 == 0x4995cdd1) {
          ffpmsg((char *)0x223305);
          *(int *)local_6c._4_8_ = 0x13a;
          return 0x13a;
        }
        if (local_6c._0_4_ != 0xb) {
          if (local_6c._0_4_ == 0x15) {
            local_7e = (undefined2)local_b8;
            ffswap2((short *)svalues,(long)nvals_00);
          }
          else if (local_6c._0_4_ == 0x29) {
            local_84 = (undefined4)local_b8;
            ffswap4((int *)dvalues,(long)nvals);
          }
          else {
            local_c0 = local_b8;
            ffswap8(dvalues,(long)nvals);
          }
        }
      }
      local_f8 = local_b0;
      local_100 = 0;
      local_f0 = 0;
      while (local_f8 != 0) {
        if (local_f8 < local_c8 - local_d8) {
          local_210 = local_f8;
        }
        else {
          local_210 = local_c8 - local_d8;
        }
        local_108 = local_210;
        local_e0 = local_d0 + local_f0 * local_e8 + local_d8 * local_98;
        ffmbyt(fptr_00,(LONGLONG)svalues,(int)((ulong)nvals_00 >> 0x20),(int *)dvalues);
        switch(local_6c._0_4_) {
        case 0xb:
          for (local_a0 = 0; local_a0 < local_108; local_a0 = local_a0 + 1) {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          }
          break;
        default:
          snprintf(local_198,0x51,"Cannot write null value to column %d which has format %s",
                   (ulong)local_44,&stack0xfffffffffffffec8);
          ffpmsg((char *)0x2237d1);
          return *(int *)local_6c._4_8_;
        case 0xe:
          for (local_a0 = 0; local_a0 < local_108; local_a0 = local_a0 + 1) {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          }
          break;
        case 0x10:
          ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          break;
        case 0x15:
          for (local_a0 = 0; local_a0 < local_108; local_a0 = local_a0 + 1) {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          }
          break;
        case 0x29:
          for (local_a0 = 0; local_a0 < local_108; local_a0 = local_a0 + 1) {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          }
          break;
        case 0x2a:
          for (local_a0 = 0; local_a0 < local_108; local_a0 = local_a0 + 1) {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          }
          break;
        case 0x51:
          for (local_a0 = 0; local_a0 < local_108; local_a0 = local_a0 + 1) {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          }
          break;
        case 0x52:
          for (local_a0 = 0; local_a0 < local_108; local_a0 = local_a0 + 1) {
            ffpbyt(fptr_01,(LONGLONG)nbytes,buffer,status_00);
          }
        }
        if (0 < *(int *)local_6c._4_8_) {
          snprintf(local_198,0x51,"Error writing %.0f thru %.0f of null values (ffpclu).",
                   (double)(local_100 + 1),(double)(local_100 + local_108));
          ffpmsg((char *)0x223842);
          if (rowlen_00 != (LONGLONG *)0x0) {
            free(rowlen_00);
          }
          return *(int *)local_6c._4_8_;
        }
        local_f8 = local_f8 - local_108;
        if (local_f8 != 0) {
          local_100 = local_108 + local_100;
          local_d8 = local_108 + local_d8;
          if (local_d8 == local_c8) {
            local_d8 = 0;
            local_f0 = local_f0 + 1;
          }
        }
      }
      if (rowlen_00 != (LONGLONG *)0x0) {
        local_108 = local_f8;
        free(rowlen_00);
      }
      local_34 = *(int *)local_6c._4_8_;
    }
    else {
      local_34 = *(int *)local_6c._4_8_;
    }
  }
  else {
    local_34 = in_R9->HDUposition;
  }
  return local_34;
}

Assistant:

int ffpclu( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelempar,     /* I - number of values to write               */
            int  *status)    /* IO - error status                           */
/*
  Set elements of a table column to the appropriate null value for the column
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer to a virtual column in a 1 or more grouped FITS primary
  array.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.
  
  This routine support COMPLEX and DOUBLE COMPLEX binary table columns, and
  sets both the real and imaginary components of the element to a NaN.
*/
{
    int tcode, maxelem, hdutype, writemode = 2, leng;
    short i2null;
    INT32BIT i4null;
    long twidth, incre;
    LONGLONG ii;
    LONGLONG largeelem, nelem, tnull, i8null;
    LONGLONG repeat, startpos, elemnum, wrtptr, rowlen, rownum, remain, next, ntodo;
    double scale, zero;
    unsigned char i1null, lognul = 0;
    char tform[20], *cstring = 0;
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value  */
    long   jbuff[2] = { -1, -1};  /* all bits set is equivalent to a NaN */
    size_t buffsize;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    nelem = nelempar;
    
    largeelem = firstelem;

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/

    /* note that writemode = 2 by default (not 1), so that the returned */
    /* repeat and incre values will be the actual values for this column. */

    /* If writing nulls to a variable length column then dummy data values  */
    /* must have already been written to the heap. */
    /* We just have to overwrite the previous values with null values. */
    /* Set writemode = 0 in this case, to test that values have been written */

    fits_get_coltype(fptr, colnum, &tcode, NULL, NULL, status);
    if (tcode < 0)
         writemode = 0;  /* this is a variable length column */

    if (abs(tcode) >= TCOMPLEX)
    { /* treat complex columns as pairs of numbers */
      largeelem = (largeelem - 1) * 2 + 1;
      nelem *= 2;
    }

    if (ffgcprll( fptr, colnum, firstrow, largeelem, nelem, writemode, &scale,
       &zero, tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

    if (tcode == TSTRING)
    {
      if (snull[0] == ASCII_NULL_UNDEFINED)
      {
        ffpmsg(
        "Null value string for ASCII table column is not defined (FTPCLU).");
        return(*status = NO_NULL);
      }

      /* allocate buffer to hold the null string.  Must write the entire */
      /* width of the column (twidth bytes) to avoid possible problems */
      /* with uninitialized FITS blocks, in case the field spans blocks */

      buffsize = maxvalue(20, twidth);
      cstring = (char *) malloc(buffsize);
      if (!cstring)
         return(*status = MEMORY_ALLOCATION);

      memset(cstring, ' ', buffsize);  /* initialize  with blanks */

      leng = strlen(snull);
      if (hdutype == BINARY_TBL)
         leng++;        /* copy the terminator too in binary tables */

      strncpy(cstring, snull, leng);  /* copy null string to temp buffer */
    }
    else if ( tcode == TBYTE  ||
              tcode == TSHORT ||
              tcode == TLONG  ||
              tcode == TLONGLONG) 
    {
      if (tnull == NULL_UNDEFINED)
      {
        ffpmsg(
        "Null value for integer table column is not defined (FTPCLU).");
        return(*status = NO_NULL);
      }

      if (tcode == TBYTE)
         i1null = (unsigned char) tnull;
      else if (tcode == TSHORT)
      {
         i2null = (short) tnull;
#if BYTESWAPPED
         ffswap2(&i2null, 1); /* reverse order of bytes */
#endif
      }
      else if (tcode == TLONG)
      {
         i4null = (INT32BIT) tnull;
#if BYTESWAPPED
         ffswap4(&i4null, 1); /* reverse order of bytes */
#endif
      }
      else
      {
         i8null = tnull;
#if BYTESWAPPED
         ffswap8((double *)(&i8null), 1);  /* reverse order of bytes */
#endif
      }
    }

    /*---------------------------------------------------------------------*/
    /*  Now write the pixels to the FITS column.                           */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to write  */
    next = 0;                 /* next element in array to be written  */
    rownum = 0;               /* row number, relative to firstrow     */
    ntodo = remain;           /* number of elements to write at one time */

    while (ntodo)
    {
        /* limit the number of pixels to process at one time to the number that
           will fit in the buffer space or to the number of pixels that remain
           in the current vector, which ever is smaller.
        */
        ntodo = minvalue(ntodo, (repeat - elemnum));
        wrtptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * incre);

        ffmbyt(fptr, wrtptr, IGNORE_EOF, status); /* move to write position */

        switch (tcode) 
        {
            case (TBYTE):
 
                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 1,  &i1null, status);
                break;

            case (TSHORT):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 2, &i2null, status);
                break;

            case (TLONG):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 4, &i4null, status);
                break;

            case (TLONGLONG):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 8, &i8null, status);
                break;

            case (TFLOAT):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 4, jbuff, status);
                break;

            case (TDOUBLE):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 8, jbuff, status);
                break;

            case (TLOGICAL):
 
                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 1, &lognul, status);
                break;

            case (TSTRING):  /* an ASCII table column */
                /* repeat always = 1, so ntodo is also guaranteed to = 1 */
                ffpbyt(fptr, twidth, cstring, status);
                break;

            default:  /*  error trap  */
                snprintf(message,FLEN_ERRMSG, 
                   "Cannot write null value to column %d which has format %s",
                     colnum,tform);
                ffpmsg(message);
                return(*status);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous write operation */
        {
           snprintf(message,FLEN_ERRMSG,
             "Error writing %.0f thru %.0f of null values (ffpclu).",
              (double) (next+1), (double) (next+ntodo));
           ffpmsg(message);

           if (cstring)
              free(cstring);

           return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum += ntodo;
            if (elemnum == repeat)  /* completed a row; start on next row */
            {
                elemnum = 0;
                rownum++;
            }
        }
        ntodo = remain;  /* this is the maximum number to do in next loop */

    }  /*  End of main while Loop  */

    if (cstring)
       free(cstring);

    return(*status);
}